

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpthreaddelegate.cpp
# Opt level: O2

void __thiscall QHttpThreadDelegate::finishedSlot(QHttpThreadDelegate *this)

{
  QArrayDataPointer<char16_t> *this_00;
  Data *pDVar1;
  char16_t *pcVar2;
  bool bVar3;
  int iVar4;
  NetworkError _t1;
  int iVar5;
  qsizetype qVar6;
  QHttpNetworkReply *this_01;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QArrayDataPointer<char16_t> local_b0;
  undefined1 local_98 [32];
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QHttpNetworkReply **)(this + 0x150);
  if (this_01 != (QHttpNetworkReply *)0x0) {
    while( true ) {
      bVar3 = QHttpNetworkReply::readAnyAvailable(this_01);
      if (!bVar3) break;
      LOCK();
      **(int **)(this + 0x48) = **(int **)(this + 0x48) + 1;
      UNLOCK();
      QHttpNetworkReply::readAny((QByteArray *)&local_58,*(QHttpNetworkReply **)(this + 0x150));
      downloadData(this,(QByteArray *)&local_58);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
      this_01 = *(QHttpNetworkReply **)(this + 0x150);
    }
    if (this[0x10] == (QHttpThreadDelegate)0x1) {
      QHttpNetworkReply::sslConfiguration((QHttpNetworkReply *)&local_58);
      sslConfigurationChanged(this,(QSslConfiguration *)&local_58);
      QSslConfiguration::~QSslConfiguration((QSslConfiguration *)&local_58);
    }
    iVar4 = QHttpNetworkReply::statusCode(*(QHttpNetworkReply **)(this + 0x150));
    if (399 < iVar4) {
      local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      qVar6 = QtPrivate::lengthHelperPointer<char>("Error transferring %1 - server replied: %2");
      latin1.m_data = "Error transferring %1 - server replied: %2";
      latin1.m_size = qVar6;
      QString::QString((QString *)&local_58,latin1);
      QHttpNetworkRequest::url((QHttpNetworkRequest *)local_98);
      this_00 = (QArrayDataPointer<char16_t> *)(local_98 + 8);
      QUrl::toString(this_00,(QHttpNetworkRequest *)local_98,0);
      QHttpNetworkReply::reasonPhrase((QString *)&local_b0,*(QHttpNetworkReply **)(this + 0x150));
      QString::arg<QString,QString>
                ((type *)&local_78,(QString *)&local_58,(QString *)this_00,(QString *)&local_b0);
      qVar6 = local_58.size;
      pcVar2 = local_58.ptr;
      pDVar1 = local_58.d;
      local_58.d = local_78.d;
      local_58.ptr = local_78.ptr;
      local_78.d = pDVar1;
      local_78.ptr = pcVar2;
      local_58.size = local_78.size;
      local_78.size = qVar6;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(this_00);
      QUrl::~QUrl((QUrl *)local_98);
      iVar4 = QHttpNetworkReply::statusCode(*(QHttpNetworkReply **)(this + 0x150));
      QHttpNetworkRequest::url((QHttpNetworkRequest *)&local_78);
      _t1 = statusCodeFromHttp(iVar4,(QUrl *)&local_78);
      error(this,_t1,(QString *)&local_58);
      QUrl::~QUrl((QUrl *)&local_78);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    }
    bVar3 = QHttpNetworkRequest::isFollowRedirects((QHttpNetworkRequest *)(this + 0x20));
    if (bVar3) {
      bVar3 = QHttpNetworkReply::isRedirecting(*(QHttpNetworkReply **)(this + 0x150));
      if (bVar3) {
        QHttpNetworkReply::redirectUrl((QHttpNetworkReply *)&local_78);
        iVar4 = QHttpNetworkReply::statusCode(*(QHttpNetworkReply **)(this + 0x150));
        QHttpNetworkReply::request((QHttpNetworkReply *)&local_58);
        iVar5 = QHttpNetworkRequest::redirectCount((QHttpNetworkRequest *)&local_58);
        redirected(this,(QUrl *)&local_78,iVar4,iVar5 + -1);
        QHttpNetworkRequest::~QHttpNetworkRequest((QHttpNetworkRequest *)&local_58);
        QUrl::~QUrl((QUrl *)&local_78);
      }
    }
    downloadFinished(this);
    QMetaObject::invokeMethod<>(*(QObject **)(this + 0x150),"deleteLater",QueuedConnection);
    QMetaObject::invokeMethod<>((QObject *)this,"deleteLater",QueuedConnection);
    *(undefined8 *)(this + 0x150) = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpThreadDelegate::finishedSlot()
{
    if (!httpReply)
        return;

#ifdef QHTTPTHREADDELEGATE_DEBUG
    qDebug() << "QHttpThreadDelegate::finishedSlot() thread=" << QThread::currentThreadId() << "result=" << httpReply->statusCode();
#endif

    // If there is still some data left emit that now
    while (httpReply->readAnyAvailable()) {
        pendingDownloadData->fetchAndAddRelease(1);
        emit downloadData(httpReply->readAny());
    }

#ifndef QT_NO_SSL
    if (ssl)
        emit sslConfigurationChanged(httpReply->sslConfiguration());
#endif

    if (httpReply->statusCode() >= 400) {
            // it's an error reply
            QString msg = QLatin1StringView(QT_TRANSLATE_NOOP("QNetworkReply",
                                                              "Error transferring %1 - server replied: %2"));
            msg = msg.arg(httpRequest.url().toString(), httpReply->reasonPhrase());
            emit error(statusCodeFromHttp(httpReply->statusCode(), httpRequest.url()), msg);
        }

    if (httpRequest.isFollowRedirects() && httpReply->isRedirecting())
        emit redirected(httpReply->redirectUrl(), httpReply->statusCode(), httpReply->request().redirectCount() - 1);

    emit downloadFinished();

    QMetaObject::invokeMethod(httpReply, "deleteLater", Qt::QueuedConnection);
    QMetaObject::invokeMethod(this, "deleteLater", Qt::QueuedConnection);
    httpReply = nullptr;
}